

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_quantization_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  undefined1 local_88 [4];
  undefined1 local_84 [4];
  RK_U32 value_15;
  RK_U32 value_14;
  RK_U32 value_13;
  RK_U32 value_12;
  RK_S32 value_11;
  RK_U32 value_10;
  char acStack_68 [2];
  RK_S8 delta_q_4;
  RK_U8 delta_coded_4;
  RK_S32 value_9;
  RK_U32 value_8;
  char acStack_5c [2];
  RK_S8 delta_q_3;
  RK_U8 delta_coded_3;
  RK_S32 value_7;
  RK_U32 value_6;
  char acStack_50 [2];
  RK_S8 delta_q_2;
  RK_U8 delta_coded_2;
  RK_S32 value_5;
  RK_U32 value_4;
  undefined1 auStack_44 [2];
  RK_S8 delta_q_1;
  RK_U8 delta_coded_1;
  RK_U32 value_3;
  RK_S32 value_2;
  RK_U32 value_1;
  RK_S8 delta_q;
  RK_S32 RStack_34;
  RK_U8 delta_coded;
  RK_U32 value;
  RK_S32 err;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _value = ctx->sequence_header;
  seq = (AV1RawSequenceHeader *)current;
  current_local = (AV1RawFrameHeader *)gb;
  gb_local = &ctx->gb;
  RStack_34 = mpp_av1_read_unsigned(gb,8,"base_q_idx",&value_1,0,0xff);
  ctx_local._4_4_ = RStack_34;
  if (-1 < RStack_34) {
    *(undefined1 *)((long)seq->encoder_buffer_delay + 0x32) = (undefined1)value_1;
    RStack_34 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)current_local,1,"delta_q_y_dc.delta_coded",&value_3,0,1);
    ctx_local._4_4_ = RStack_34;
    if (-1 < RStack_34) {
      value_2._3_1_ = (char)value_3;
      if ((char)value_3 == '\0') {
        value_2._2_1_ = 0;
      }
      else {
        RStack_34 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,"delta_q_y_dc.delta_q",
                                        (RK_S32 *)auStack_44,-0x40,0x3f);
        if (RStack_34 < 0) {
          return RStack_34;
        }
        value_2._2_1_ = auStack_44[0];
      }
      *(undefined1 *)((long)seq->encoder_buffer_delay + 0x33) = value_2._2_1_;
      if (*(int *)&gb_local[0x50].buf < 2) {
        *(undefined1 *)((long)seq->encoder_buffer_delay + 0x35) = 0;
        *(undefined1 *)((long)seq->encoder_buffer_delay + 0x36) = 0;
        *(undefined1 *)((long)seq->encoder_buffer_delay + 0x37) = 0;
        *(undefined1 *)(seq->encoder_buffer_delay + 0xe) = 0;
      }
      else {
        if ((_value->color_config).separate_uv_delta_q == '\0') {
          *(undefined1 *)(seq->encoder_buffer_delay + 0xd) = 0;
        }
        else {
          RStack_34 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,1,"diff_uv_delta",&value_4,0,1);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          *(undefined1 *)(seq->encoder_buffer_delay + 0xd) = (undefined1)value_4;
        }
        RStack_34 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,1,"delta_q_u_dc.delta_coded",
                               (RK_U32 *)acStack_50,0,1);
        if (RStack_34 < 0) {
          return RStack_34;
        }
        if (acStack_50[0] == '\0') {
          value_5._2_1_ = 0;
        }
        else {
          RStack_34 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,"delta_q_u_dc.delta_q",
                                          (RK_S32 *)&value_6,-0x40,0x3f);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          value_5._2_1_ = (undefined1)value_6;
        }
        *(undefined1 *)((long)seq->encoder_buffer_delay + 0x35) = value_5._2_1_;
        RStack_34 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,1,"delta_q_u_ac.delta_coded",
                               (RK_U32 *)acStack_5c,0,1);
        if (RStack_34 < 0) {
          return RStack_34;
        }
        if (acStack_5c[0] == '\0') {
          value_7._2_1_ = 0;
        }
        else {
          RStack_34 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,"delta_q_u_ac.delta_q",
                                          (RK_S32 *)&value_8,-0x40,0x3f);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          value_7._2_1_ = (undefined1)value_8;
        }
        *(undefined1 *)((long)seq->encoder_buffer_delay + 0x36) = value_7._2_1_;
        if ((char)seq->encoder_buffer_delay[0xd] == '\0') {
          *(undefined1 *)((long)seq->encoder_buffer_delay + 0x37) =
               *(undefined1 *)((long)seq->encoder_buffer_delay + 0x35);
          *(undefined1 *)(seq->encoder_buffer_delay + 0xe) =
               *(undefined1 *)((long)seq->encoder_buffer_delay + 0x36);
        }
        else {
          RStack_34 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,1,"delta_q_v_dc.delta_coded",
                                 (RK_U32 *)acStack_68,0,1);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          if (acStack_68[0] == '\0') {
            value_9._2_1_ = 0;
          }
          else {
            RStack_34 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,"delta_q_v_dc.delta_q",
                                            (RK_S32 *)&value_10,-0x40,0x3f);
            if (RStack_34 < 0) {
              return RStack_34;
            }
            value_9._2_1_ = (undefined1)value_10;
          }
          *(undefined1 *)((long)seq->encoder_buffer_delay + 0x37) = value_9._2_1_;
          RStack_34 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,1,"delta_q_v_ac.delta_coded",
                                 &value_12,0,1);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          value_11._3_1_ = (char)value_12;
          if ((char)value_12 == '\0') {
            value_11._2_1_ = 0;
          }
          else {
            RStack_34 = mpp_av1_read_signed((BitReadCtx_t *)current_local,7,"delta_q_v_ac.delta_q",
                                            (RK_S32 *)&value_13,-0x40,0x3f);
            if (RStack_34 < 0) {
              return RStack_34;
            }
            value_11._2_1_ = (undefined1)value_13;
          }
          *(undefined1 *)(seq->encoder_buffer_delay + 0xe) = value_11._2_1_;
        }
      }
      RStack_34 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"using_qmatrix",&value_14,0,1);
      ctx_local._4_4_ = RStack_34;
      if (-1 < RStack_34) {
        *(undefined1 *)((long)seq->encoder_buffer_delay + 0x39) = (undefined1)value_14;
        if (*(char *)((long)seq->encoder_buffer_delay + 0x39) != '\0') {
          RStack_34 = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,4,"qm_y",&value_15,0,0xf);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          *(undefined1 *)((long)seq->encoder_buffer_delay + 0x3a) = (undefined1)value_15;
          RStack_34 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)current_local,4,"qm_u",(RK_U32 *)local_84,0,0xf);
          if (RStack_34 < 0) {
            return RStack_34;
          }
          *(undefined1 *)((long)seq->encoder_buffer_delay + 0x3b) = local_84[0];
          if ((_value->color_config).separate_uv_delta_q == '\0') {
            *(undefined1 *)(seq->encoder_buffer_delay + 0xf) =
                 *(undefined1 *)((long)seq->encoder_buffer_delay + 0x3b);
          }
          else {
            RVar1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,4,"qm_v",(RK_U32 *)local_88,0,0xf);
            if (RVar1 < 0) {
              return RVar1;
            }
            *(undefined1 *)(seq->encoder_buffer_delay + 0xf) = local_88[0];
          }
        }
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32 mpp_av1_quantization_params(AV1Context *ctx, BitReadCtx_t *gb,
                                          AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 err;

    fb(8, base_q_idx);

    delta_q(delta_q_y_dc);

    if (ctx->num_planes > 1) {
        if (seq->color_config.separate_uv_delta_q)
            flag(diff_uv_delta);
        else
            infer(diff_uv_delta, 0);

        delta_q(delta_q_u_dc);
        delta_q(delta_q_u_ac);

        if (current->diff_uv_delta) {
            delta_q(delta_q_v_dc);
            delta_q(delta_q_v_ac);
        } else {
            infer(delta_q_v_dc, current->delta_q_u_dc);
            infer(delta_q_v_ac, current->delta_q_u_ac);
        }
    } else {
        infer(delta_q_u_dc, 0);
        infer(delta_q_u_ac, 0);
        infer(delta_q_v_dc, 0);
        infer(delta_q_v_ac, 0);
    }

    flag(using_qmatrix);
    if (current->using_qmatrix) {
        fb(4, qm_y);
        fb(4, qm_u);
        if (seq->color_config.separate_uv_delta_q)
            fb(4, qm_v);
        else
            infer(qm_v, current->qm_u);
    }

    return 0;
}